

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

reference __thiscall
QVLABase<char>::emplace_back_impl<char_const&>
          (QVLABase<char> *this,qsizetype prealloc,void *array,char *args)

{
  qsizetype *pqVar1;
  long lVar2;
  void *pvVar3;
  long aalloc;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    aalloc = lVar2 + 1;
    if (lVar2 + 1 < lVar2 * 2) {
      aalloc = lVar2 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar2,aalloc);
  }
  lVar2 = (this->super_QVLABaseBase).s;
  pvVar3 = (this->super_QVLABaseBase).ptr;
  *(char *)((long)pvVar3 + lVar2) = *args;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar3 + lVar2);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }